

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

llama_token
common_sampler_sample(common_sampler *gsmpl,llama_context *ctx,int idx,bool grammar_first)

{
  llama_token_data_array *plVar1;
  long lVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  undefined8 uVar4;
  llama_token lVar5;
  llama_token_data_array single_token_data_array;
  llama_token local_5c [3];
  llama_token *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  common_sampler::set_logits(gsmpl,ctx,idx);
  plVar1 = &gsmpl->cur_p;
  if ((int)CONCAT71(in_register_00000009,grammar_first) != 0) {
    llama_sampler_apply(gsmpl->grmr,plVar1);
  }
  llama_sampler_apply(gsmpl->chain,plVar1);
  lVar2 = (gsmpl->cur_p).selected;
  if (lVar2 != -1) {
    lVar5 = plVar1->data[lVar2].id;
    if (!grammar_first) {
      local_50 = local_5c;
      local_5c[1] = 0x3f800000;
      local_5c[2] = 0;
      local_48 = 1;
      local_40 = 0xffffffffffffffff;
      local_38 = 0;
      local_5c[0] = lVar5;
      llama_sampler_apply(gsmpl->grmr,&local_50);
      if ((float)local_50[1] <= -INFINITY) {
        common_sampler::set_logits(gsmpl,ctx,idx);
        llama_sampler_apply(gsmpl->grmr,plVar1);
        llama_sampler_apply(gsmpl->chain,plVar1);
        lVar2 = (gsmpl->cur_p).selected;
        if (lVar2 == -1) {
          pcVar3 = 
          "cur_p.selected != -1 && \"no selected token during re-sampling - check your sampling configuration\""
          ;
          uVar4 = 0x17e;
          goto LAB_00212bc3;
        }
        lVar5 = plVar1->data[lVar2].id;
      }
    }
    return lVar5;
  }
  pcVar3 = 
  "cur_p.selected != -1 && \"no selected token during sampling - check your sampling configuration\""
  ;
  uVar4 = 0x162;
LAB_00212bc3:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
             ,uVar4,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

llama_token common_sampler_sample(struct common_sampler * gsmpl, struct llama_context * ctx, int idx, bool grammar_first) {
    gsmpl->set_logits(ctx, idx);

    auto & grmr  = gsmpl->grmr;
    auto & chain = gsmpl->chain;
    auto & cur_p = gsmpl->cur_p; // initialized by set_logits

    if (grammar_first) {
        llama_sampler_apply(grmr, &cur_p);
    }

    llama_sampler_apply(chain, &cur_p);

    GGML_ASSERT(cur_p.selected != -1 && "no selected token during sampling - check your sampling configuration");

    const llama_token id = cur_p.data[cur_p.selected].id;

    if (grammar_first) {
        return id;
    }

    // check if it the sampled token fits the grammar
    {
        llama_token_data       single_token_data       = { id, 1.0f, 0.0f };
        llama_token_data_array single_token_data_array = { &single_token_data, 1, -1, false };

        llama_sampler_apply(grmr, &single_token_data_array);

        const bool is_valid = single_token_data_array.data[0].logit != -INFINITY;
        if (is_valid) {
            return id;
        }
    }

    // resampling:
    // if the token is not valid, sample again, but first apply the grammar sampler and then the sampling chain
    gsmpl->set_logits(ctx, idx);

    llama_sampler_apply(grmr,  &cur_p);
    llama_sampler_apply(chain, &cur_p);

    GGML_ASSERT(cur_p.selected != -1 && "no selected token during re-sampling - check your sampling configuration");

    return cur_p.data[cur_p.selected].id;
}